

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropymode.c
# Opt level: O3

int av1_get_palette_color_index_context
              (uint8_t *color_map,int stride,int r,int c,int palette_size,uint8_t *color_order,
              int *color_idx)

{
  ulong uVar1;
  byte bVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  undefined8 local_b4;
  uint local_ac [12];
  int color_neighbors [3];
  int scores [18];
  int inverse_color_order [8];
  
  if (c < 1) {
    local_b4 = 0xffffffffffffffff;
    if (r < 1) goto LAB_0039b6da;
    lVar4 = (long)((r + -1) * stride + c);
  }
  else {
    if (r < 1) {
      local_b4 = CONCAT44(0xffffffff,(uint)color_map[(long)(r * stride + c) + -1]);
LAB_0039b6da:
      local_ac[0] = 0xffffffff;
      goto LAB_0039b6e0;
    }
    lVar4 = (long)((r + -1) * stride + c);
    local_b4 = (ulong)CONCAT14(color_map[lVar4 + -1],(uint)color_map[(long)(r * stride + c) + -1]);
  }
  local_ac[0] = (uint)color_map[lVar4];
LAB_0039b6e0:
  color_neighbors[1] = 0;
  color_neighbors[2] = 0;
  scores[0] = 0;
  scores[1] = 0;
  local_ac[9] = 0;
  local_ac[10] = 0;
  stack0xffffffffffffff80 = 0;
  local_ac[5] = 0;
  local_ac[6] = 0;
  local_ac[7] = 0;
  local_ac[8] = 0;
  local_ac[1] = 0;
  local_ac[2] = 0;
  local_ac[3] = 0;
  local_ac[4] = 0;
  scores[2] = 0;
  scores[3] = 0;
  lVar4 = 0;
  do {
    if (-1 < (long)*(int *)((long)&local_b4 + lVar4)) {
      local_ac[(long)*(int *)((long)&local_b4 + lVar4) + 1] =
           local_ac[(long)*(int *)((long)&local_b4 + lVar4) + 1] +
           *(int *)((long)av1_get_palette_color_index_context::weights + lVar4);
    }
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0xc);
  color_order[0] = '\0';
  color_order[1] = '\x01';
  color_order[2] = '\x02';
  color_order[3] = '\x03';
  scores[6] = 0;
  scores[7] = 1;
  scores[8] = 2;
  scores[9] = 3;
  color_order[4] = '\x04';
  color_order[5] = '\x05';
  color_order[6] = '\x06';
  color_order[7] = '\a';
  scores[10] = 4;
  scores[0xb] = 5;
  scores[0xc] = 6;
  scores[0xd] = 7;
  uVar9 = 1;
  uVar6 = 0;
  do {
    uVar1 = uVar6 + 1;
    uVar7 = (uint)uVar6;
    if ((long)uVar1 < (long)palette_size) {
      uVar11 = local_ac[uVar6 + 1];
      uVar8 = uVar6 & 0xffffffff;
      uVar10 = uVar9;
      do {
        uVar3 = local_ac[uVar10 + 1];
        if ((int)uVar11 < (int)uVar3) {
          uVar8 = uVar10 & 0xffffffff;
        }
        uVar7 = (uint)uVar8;
        if ((int)uVar11 < (int)uVar3) {
          uVar11 = uVar3;
        }
        uVar10 = uVar10 + 1;
      } while ((uint)palette_size != uVar10);
    }
    if (uVar6 != uVar7) {
      lVar4 = (long)(int)uVar7;
      uVar7 = local_ac[lVar4 + 1];
      bVar2 = color_order[lVar4];
      for (; (long)uVar6 < lVar4; lVar4 = lVar4 + -1) {
        local_ac[lVar4 + 1] = local_ac[lVar4];
        color_order[lVar4] = color_order[lVar4 + -1];
        scores[(ulong)color_order[lVar4 + -1] + 6] = (int)lVar4;
      }
      local_ac[uVar6 + 1] = uVar7;
      color_order[uVar6] = bVar2;
      scores[(ulong)bVar2 + 6] = (uint)uVar6;
    }
    uVar9 = uVar9 + 1;
    uVar6 = uVar1;
  } while (uVar1 != 3);
  if (color_idx != (int *)0x0) {
    *color_idx = scores[(ulong)color_map[r * stride + c] + 6];
  }
  lVar4 = 0;
  iVar5 = 0;
  do {
    iVar5 = iVar5 + *(int *)((long)av1_get_palette_color_index_context::hash_multipliers + lVar4) *
                    *(int *)((long)local_ac + lVar4 + 4);
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0xc);
  return av1_palette_color_index_context_lookup[iVar5];
}

Assistant:

int av1_get_palette_color_index_context(const uint8_t *color_map, int stride,
                                        int r, int c, int palette_size,
                                        uint8_t *color_order, int *color_idx) {
  assert(palette_size <= PALETTE_MAX_SIZE);
  assert(r > 0 || c > 0);

  // Get color indices of neighbors.
  int color_neighbors[NUM_PALETTE_NEIGHBORS];
  color_neighbors[0] = (c - 1 >= 0) ? color_map[r * stride + c - 1] : -1;
  color_neighbors[1] =
      (c - 1 >= 0 && r - 1 >= 0) ? color_map[(r - 1) * stride + c - 1] : -1;
  color_neighbors[2] = (r - 1 >= 0) ? color_map[(r - 1) * stride + c] : -1;

  // The +10 below should not be needed. But we get a warning "array subscript
  // is above array bounds [-Werror=array-bounds]" without it, possibly due to
  // this (or similar) bug: https://gcc.gnu.org/bugzilla/show_bug.cgi?id=59124
  int scores[PALETTE_MAX_SIZE + 10] = { 0 };
  int i;
  static const int weights[NUM_PALETTE_NEIGHBORS] = { 2, 1, 2 };
  for (i = 0; i < NUM_PALETTE_NEIGHBORS; ++i) {
    if (color_neighbors[i] >= 0) {
      scores[color_neighbors[i]] += weights[i];
    }
  }

  int inverse_color_order[PALETTE_MAX_SIZE];
  for (i = 0; i < PALETTE_MAX_SIZE; ++i) {
    color_order[i] = i;
    inverse_color_order[i] = i;
  }

  // Get the top NUM_PALETTE_NEIGHBORS scores (sorted from large to small).
  for (i = 0; i < NUM_PALETTE_NEIGHBORS; ++i) {
    int max = scores[i];
    int max_idx = i;
    for (int j = i + 1; j < palette_size; ++j) {
      if (scores[j] > max) {
        max = scores[j];
        max_idx = j;
      }
    }
    if (max_idx != i) {
      // Move the score at index 'max_idx' to index 'i', and shift the scores
      // from 'i' to 'max_idx - 1' by 1.
      const int max_score = scores[max_idx];
      const uint8_t max_color_order = color_order[max_idx];
      for (int k = max_idx; k > i; --k) {
        scores[k] = scores[k - 1];
        color_order[k] = color_order[k - 1];
        inverse_color_order[color_order[k]] = k;
      }
      scores[i] = max_score;
      color_order[i] = max_color_order;
      inverse_color_order[color_order[i]] = i;
    }
  }

  if (color_idx != NULL)
    *color_idx = inverse_color_order[color_map[r * stride + c]];

  // Get hash value of context.
  int color_index_ctx_hash = 0;
  static const int hash_multipliers[NUM_PALETTE_NEIGHBORS] = { 1, 2, 2 };
  for (i = 0; i < NUM_PALETTE_NEIGHBORS; ++i) {
    color_index_ctx_hash += scores[i] * hash_multipliers[i];
  }
  assert(color_index_ctx_hash > 0);
  assert(color_index_ctx_hash <= MAX_COLOR_CONTEXT_HASH);

  // Lookup context from hash.
  const int color_index_ctx =
      av1_palette_color_index_context_lookup[color_index_ctx_hash];
  assert(color_index_ctx >= 0);
  assert(color_index_ctx < PALETTE_COLOR_INDEX_CONTEXTS);
  return color_index_ctx;
}